

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O0

int __thiscall CServer::ClientCountry(CServer *this,int ClientID)

{
  int ClientID_local;
  CServer *this_local;
  int local_4;
  
  if (((ClientID < 0) || (0x3f < ClientID)) || (this->m_aClients[ClientID].m_State == 0)) {
    local_4 = -1;
  }
  else if (this->m_aClients[ClientID].m_State == 5) {
    local_4 = this->m_aClients[ClientID].m_Country;
  }
  else {
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int CServer::ClientCountry(int ClientID) const
{
	if(ClientID < 0 || ClientID >= MAX_CLIENTS || m_aClients[ClientID].m_State == CServer::CClient::STATE_EMPTY)
		return -1;
	if(m_aClients[ClientID].m_State == CServer::CClient::STATE_INGAME)
		return m_aClients[ClientID].m_Country;
	else
		return -1;
}